

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void us32_to_us16_test(int line,UTF_US32 *str1,UTF_US16 *str2,bool ok)

{
  size_type sVar1;
  pointer pcVar2;
  ulong uVar3;
  char16_t cVar4;
  char16_t *pcVar5;
  size_type sVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  UTF_US16 tmp;
  UTF_UC16 buf [256];
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_260;
  UTF_US16 *local_240;
  char16_t local_238 [255];
  char16_t acStack_3a [5];
  
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = L'\0';
  sVar1 = str1->_M_string_length;
  local_240 = str2;
  if (sVar1 != 0) {
    pcVar2 = (str1->_M_dataplus)._M_p;
    lVar7 = 0;
    do {
      uVar10 = *(uint *)((long)pcVar2 + lVar7);
      cVar4 = L'?';
      if (uVar10 < 0x110000) {
        if (0xffff < uVar10) {
          std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::push_back
                    (&local_260,(short)(uVar10 + 0x3ff0000 >> 10) + L'\xd800');
          uVar10 = uVar10 & 0x3ff | 0xdc00;
        }
        cVar4 = (char16_t)uVar10;
      }
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      push_back(&local_260,cVar4);
      lVar7 = lVar7 + 4;
    } while (sVar1 << 2 != lVar7);
  }
  UTF_test(line,ok);
  uVar3 = local_240->_M_string_length;
  sVar6 = local_260._M_string_length;
  if (uVar3 < local_260._M_string_length) {
    sVar6 = uVar3;
  }
  if (sVar6 != 0) {
    uVar8 = 0;
    do {
      if ((local_240->_M_dataplus)._M_p[uVar8] != local_260._M_dataplus._M_p[uVar8]) {
        bVar11 = false;
        goto LAB_001024b0;
      }
      uVar8 = uVar8 + 1;
    } while (sVar6 != uVar8);
  }
  bVar11 = local_260._M_string_length == uVar3;
LAB_001024b0:
  UTF_test(line,bVar11);
  sVar1 = str1->_M_string_length;
  bVar11 = true;
  if (sVar1 == 0) {
    pcVar5 = local_238;
  }
  else {
    pcVar2 = (str1->_M_dataplus)._M_p;
    pcVar5 = local_238;
    lVar7 = 0;
    lVar9 = 0;
    do {
      uVar10 = *(uint *)((long)pcVar2 + lVar7);
      if (uVar10 < 0x110000) {
        if (uVar10 < 0x10000) {
          if (lVar9 != 0x1fe) {
            lVar9 = lVar9 + 2;
            *pcVar5 = (char16_t)uVar10;
            goto LAB_0010255f;
          }
        }
        else if (lVar9 != 0x1fe) {
          *pcVar5 = (short)(uVar10 + 0x3ff0000 >> 10) + L'\xd800';
          if (lVar9 != 0x1fc) {
            *(char16_t *)((long)local_238 + lVar9 + 2) = (char16_t)uVar10 & 0x3ffU | 0xdc00;
            lVar9 = lVar9 + 4;
            goto LAB_0010255f;
          }
          pcVar5 = acStack_3a;
        }
LAB_00102585:
        bVar11 = false;
        break;
      }
      if (lVar9 == 0x1fe) goto LAB_00102585;
      lVar9 = lVar9 + 2;
      *pcVar5 = L'?';
LAB_0010255f:
      pcVar5 = (char16_t *)((long)local_238 + lVar9);
      lVar7 = lVar7 + 4;
    } while (sVar1 << 2 != lVar7);
  }
  *pcVar5 = L'\0';
  UTF_test(line,bVar11);
  cVar4 = *local_260._M_dataplus._M_p;
  if (cVar4 == L'\0') {
    pcVar5 = local_238;
  }
  else {
    pcVar5 = local_238;
    lVar7 = 0;
    do {
      if (*pcVar5 == L'\0') goto LAB_001025e8;
      bVar11 = local_260._M_string_length + 1 == lVar7;
      if ((cVar4 != *pcVar5) || (local_260._M_string_length + 1 == lVar7)) goto LAB_001025ef;
      pcVar5 = pcVar5 + 1;
      cVar4 = local_260._M_dataplus._M_p[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (cVar4 != L'\0');
  }
  cVar4 = L'\0';
LAB_001025e8:
  bVar11 = cVar4 == *pcVar5;
LAB_001025ef:
  UTF_test(line,bVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  return;
}

Assistant:

void us32_to_us16_test(int line, const UTF_US32& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_U_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_uj32_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}